

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O0

void __thiscall deqp::egl::MakeCurrentPerfCase::destroyContexts(MakeCurrentPerfCase *this)

{
  iterator iVar1;
  bool bVar2;
  deUint32 err;
  deBool dVar3;
  Library *pLVar4;
  size_type sVar5;
  reference ppvVar6;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_30;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_28;
  iterator iter;
  EGLDisplay display;
  Library *egl;
  MakeCurrentPerfCase *this_local;
  
  pLVar4 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  sVar5 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_contexts);
  if (sVar5 != 0) {
    iter._M_current = (void **)this->m_display;
    local_28._M_current =
         (void **)std::vector<void_*,_std::allocator<void_*>_>::begin(&this->m_contexts);
    while( true ) {
      local_30._M_current =
           (void **)std::vector<void_*,_std::allocator<void_*>_>::end(&this->m_contexts);
      bVar2 = __gnu_cxx::operator!=(&local_28,&local_30);
      if (!bVar2) break;
      ppvVar6 = __gnu_cxx::__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>
                ::operator*(&local_28);
      if (*ppvVar6 != (void *)0x0) {
        do {
          iVar1._M_current = iter._M_current;
          ppvVar6 = __gnu_cxx::
                    __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>::
                    operator*(&local_28);
          (*pLVar4->_vptr_Library[0x13])(pLVar4,iVar1._M_current,*ppvVar6);
          err = (*pLVar4->_vptr_Library[0x1f])();
          eglu::checkError(err,"destroyContext(display, *iter)",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMakeCurrentPerfTests.cpp"
                           ,400);
          dVar3 = ::deGetFalse();
        } while (dVar3 != 0);
      }
      ppvVar6 = __gnu_cxx::__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>
                ::operator*(&local_28);
      *ppvVar6 = (void *)0x0;
      __gnu_cxx::__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>::
      operator++(&local_28);
    }
    std::vector<void_*,_std::allocator<void_*>_>::clear(&this->m_contexts);
  }
  return;
}

Assistant:

void MakeCurrentPerfCase::destroyContexts (void)
{
	const Library&	egl	= m_eglTestCtx.getLibrary();
	if (m_contexts.size() > 0)
	{
		EGLDisplay display = m_display;

		for (vector<EGLContext>::iterator iter = m_contexts.begin(); iter != m_contexts.end(); ++iter)
		{
			if (*iter != EGL_NO_CONTEXT)
				EGLU_CHECK_CALL(egl, destroyContext(display, *iter));
			*iter = EGL_NO_CONTEXT;
		}

		m_contexts.clear();
	}
}